

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void BIT_addBitsFast(BIT_CStream_t *bitC,size_t value,uint nbBits)

{
  uint uVar1;
  
  if (value >> ((byte)nbBits & 0x3f) != 0) {
    __assert_fail("(value>>nbBits) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5ea,"void BIT_addBitsFast(BIT_CStream_t *, size_t, unsigned int)");
  }
  uVar1 = nbBits + bitC->bitPos;
  if (uVar1 < 0x40) {
    bitC->bitContainer = bitC->bitContainer | value << ((byte)bitC->bitPos & 0x3f);
    bitC->bitPos = uVar1;
    return;
  }
  __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5eb,"void BIT_addBitsFast(BIT_CStream_t *, size_t, unsigned int)");
}

Assistant:

MEM_STATIC void BIT_addBitsFast(BIT_CStream_t* bitC,
                                size_t value, unsigned nbBits)
{
    assert((value>>nbBits) == 0);
    assert(nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8);
    bitC->bitContainer |= value << bitC->bitPos;
    bitC->bitPos += nbBits;
}